

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void prvTidyFreeNode(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  next = node;
  while (next != (Node *)0x0) {
    pNVar1 = next->next;
    prvTidyFreeAttrs(doc,next);
    prvTidyFreeNode(doc,next->content);
    (*doc->allocator->vtbl->free)(doc->allocator,next->element);
    if (next->type == RootNode) {
      next->content = (Node *)0x0;
      next = pNVar1;
    }
    else {
      (*doc->allocator->vtbl->free)(doc->allocator,next);
      next = pNVar1;
    }
  }
  return;
}

Assistant:

void TY_(FreeNode)( TidyDocImpl* doc, Node *node )
{
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_ALLOCATION)
    /* avoid showing free of root node! */
    if (node) {
        if (RootNode != node->type) {
            SPRTF("Free node %p\n", node);
        }
        else {
            SPRTF("Root node %p\n", node);
        }
    }
#endif
    /* this is no good ;=((
    if (node && doc && doc->lexer) {
        if (node == doc->lexer->token) {
            doc->lexer->token = NULL; // TY_(NewNode)( doc->lexer->allocator, doc->lexer );
        }
    }
      ----------------- */
    while ( node )
    {
        Node* next = node->next;

        TY_(FreeAttrs)( doc, node );
        TY_(FreeNode)( doc, node->content );
        TidyDocFree( doc, node->element );
        if (RootNode != node->type)
            TidyDocFree( doc, node );
        else
            node->content = NULL;

        node = next;
    }
}